

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O1

CURLcode Curl_client_write(connectdata *conn,int type,char *ptr,size_t len)

{
  curl_off_t *pcVar1;
  undefined1 *puVar2;
  Curl_easy *pCVar3;
  bool bVar4;
  CURLcode CVar5;
  short *psVar6;
  size_t sVar7;
  size_t sVar8;
  curl_write_callback p_Var9;
  short *psVar10;
  char *pcVar11;
  curl_write_callback p_Var12;
  ulong uVar13;
  CURLcode local_64;
  
  pCVar3 = conn->data;
  if (len == 0) {
    len = strlen(ptr);
  }
  if (((((type & 1U) != 0) && ((conn->handler->protocol & 0xc) != 0)) &&
      ((conn->proto).ftpc.transfertype == 'A')) && (len != 0 && ptr != (char *)0x0)) {
    if (((pCVar3->state).field_0x424 & 1) != 0) {
      if (*ptr == '\n') {
        len = len - 1;
        memmove(ptr,ptr + 1,len);
        pcVar1 = &(pCVar3->state).crlf_conversions;
        *pcVar1 = *pcVar1 + 1;
      }
      puVar2 = &(pCVar3->state).field_0x424;
      *puVar2 = *puVar2 & 0xfe;
    }
    psVar6 = (short *)memchr(ptr,0xd,len);
    if (psVar6 != (short *)0x0) {
      for (psVar10 = psVar6; psVar10 < ptr + (len - 1); psVar10 = (short *)((long)psVar10 + 1)) {
        if (*psVar10 == 0xa0d) {
          pcVar11 = (char *)((long)psVar10 + 1);
          psVar10 = (short *)((long)psVar10 + 1);
          *(char *)psVar6 = *pcVar11;
          pcVar1 = &(pCVar3->state).crlf_conversions;
          *pcVar1 = *pcVar1 + 1;
        }
        else if ((char)*psVar10 == '\r') {
          *(char *)psVar6 = '\n';
        }
        else {
          *(char *)psVar6 = (char)*psVar10;
        }
        psVar6 = (short *)((long)psVar6 + 1);
      }
      if (psVar10 < ptr + len) {
        if ((char)*psVar10 == '\r') {
          *(char *)psVar6 = '\n';
          puVar2 = &(pCVar3->state).field_0x424;
          *puVar2 = *puVar2 | 1;
        }
        else {
          *(char *)psVar6 = (char)*psVar10;
        }
        psVar6 = (short *)((long)psVar6 + 1);
      }
      if (psVar6 < ptr + len) {
        *(char *)psVar6 = '\0';
      }
      len = (long)psVar6 - (long)ptr;
    }
  }
  if (len == 0) {
LAB_0056fb4f:
    local_64 = CURLE_OK;
  }
  else {
    pCVar3 = conn->data;
    if (((pCVar3->req).keepon & 0x10) != 0) {
      CVar5 = pausewrite(pCVar3,type,ptr,len);
      return CVar5;
    }
    if ((type & 1U) == 0) {
      p_Var12 = (curl_write_callback)0x0;
    }
    else {
      p_Var12 = (pCVar3->set).fwrite_func;
    }
    pcVar11 = ptr;
    uVar13 = len;
    if ((type & 2U) == 0) {
      p_Var9 = (curl_write_callback)0x0;
    }
    else {
      p_Var9 = (pCVar3->set).fwrite_header;
      if (p_Var9 == (curl_write_callback)0x0) {
        if ((pCVar3->set).writeheader == (void *)0x0) {
          p_Var9 = (curl_write_callback)0x0;
        }
        else {
          p_Var9 = (pCVar3->set).fwrite_func;
        }
      }
    }
    do {
      if (uVar13 == 0) {
        if (p_Var9 != (curl_write_callback)0x0) {
          Curl_set_in_callback(pCVar3,true);
          sVar8 = (*p_Var9)(ptr,1,len,(pCVar3->set).writeheader);
          Curl_set_in_callback(pCVar3,false);
          if (sVar8 == 0x10000001) {
            local_64 = pausewrite(pCVar3,2,ptr,len);
            bVar4 = false;
          }
          else {
            bVar4 = true;
            if (sVar8 != len) {
              bVar4 = false;
              Curl_failf(pCVar3,"Failed writing header");
              local_64 = CURLE_WRITE_ERROR;
            }
          }
          if (!bVar4) {
            return local_64;
          }
        }
        goto LAB_0056fb4f;
      }
      sVar8 = 0x4000;
      if (uVar13 < 0x4000) {
        sVar8 = uVar13;
      }
      if (p_Var12 == (curl_write_callback)0x0) {
LAB_0056fa9e:
        pcVar11 = pcVar11 + sVar8;
        uVar13 = uVar13 - sVar8;
        bVar4 = true;
      }
      else {
        Curl_set_in_callback(pCVar3,true);
        sVar7 = (*p_Var12)(pcVar11,1,sVar8,(pCVar3->set).out);
        Curl_set_in_callback(pCVar3,false);
        if (sVar7 == 0x10000001) {
          if ((conn->handler->flags & 0x10) == 0) {
            local_64 = pausewrite(pCVar3,type,pcVar11,uVar13);
            bVar4 = false;
          }
          else {
            Curl_failf(pCVar3,"Write callback asked for PAUSE when not supported!");
LAB_0056fa8c:
            bVar4 = false;
            local_64 = CURLE_WRITE_ERROR;
          }
        }
        else {
          bVar4 = true;
          if (sVar7 != sVar8) {
            Curl_failf(pCVar3,"Failed writing body (%zu != %zu)",sVar7,sVar8);
            goto LAB_0056fa8c;
          }
        }
        if (bVar4) goto LAB_0056fa9e;
        bVar4 = false;
      }
    } while (bVar4);
  }
  return local_64;
}

Assistant:

CURLcode Curl_client_write(struct connectdata *conn,
                           int type,
                           char *ptr,
                           size_t len)
{
  struct Curl_easy *data = conn->data;

  if(0 == len)
    len = strlen(ptr);

  DEBUGASSERT(type <= 3);

  /* FTP data may need conversion. */
  if((type & CLIENTWRITE_BODY) &&
    (conn->handler->protocol & PROTO_FAMILY_FTP) &&
    conn->proto.ftpc.transfertype == 'A') {
    /* convert from the network encoding */
    CURLcode result = Curl_convert_from_network(data, ptr, len);
    /* Curl_convert_from_network calls failf if unsuccessful */
    if(result)
      return result;

#ifdef CURL_DO_LINEEND_CONV
    /* convert end-of-line markers */
    len = convert_lineends(data, ptr, len);
#endif /* CURL_DO_LINEEND_CONV */
    }

  return chop_write(conn, type, ptr, len);
}